

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByCamelcaseName(Descriptor *this,string *key)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  
  pFVar1 = FileDescriptorTables::FindFieldByCamelcaseName
                     (*(FileDescriptorTables **)(*(long *)(this + 0x10) + 0xa8),this,key);
  if (pFVar1 == (FieldDescriptor *)0x0) {
    pFVar2 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar2 = (FieldDescriptor *)0x0;
    if (pFVar1[0x50] == (FieldDescriptor)0x0) {
      pFVar2 = pFVar1;
    }
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor*
Descriptor::FindFieldByCamelcaseName(const string& key) const {
  const FieldDescriptor* result =
    file()->tables_->FindFieldByCamelcaseName(this, key);
  if (result == NULL || result->is_extension()) {
    return NULL;
  } else {
    return result;
  }
}